

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::setPositionForIndex(QListView *this,QPoint *position,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QListViewPrivate *this_00;
  QModelIndex *in_RDX;
  QAbstractItemViewPrivate *in_RSI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QListView *)0x87ceaf);
  uVar4 = true;
  if (this_00->movement != Static) {
    bVar2 = QAbstractItemViewPrivate::isIndexValid(in_RSI,in_RDX);
    uVar4 = true;
    if (bVar2) {
      QModelIndex::parent((QModelIndex *)in_RSI);
      bVar2 = ::operator!=((QModelIndex *)this_00,
                           (QPersistentModelIndex *)CONCAT17(uVar4,in_stack_ffffffffffffffb8));
      uVar4 = true;
      if (!bVar2) {
        iVar3 = QModelIndex::column(in_RDX);
        uVar4 = iVar3 != this_00->column;
      }
    }
  }
  if ((bool)uVar4 == false) {
    QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
    (*this_00->commonListView->_vptr_QCommonListViewBase[0x13])
              (this_00->commonListView,in_RSI,in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::setPositionForIndex(const QPoint &position, const QModelIndex &index)
{
    Q_D(QListView);
    if (d->movement == Static
        || !d->isIndexValid(index)
        || index.parent() != d->root
        || index.column() != d->column)
        return;

    d->executePostedLayout();
    d->commonListView->setPositionForIndex(position, index);
}